

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder_graph.cc
# Opt level: O2

vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
* __thiscall
S2Builder::Graph::PolylineBuilder::BuildWalks
          (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           *__return_storage_ptr__,PolylineBuilder *this)

{
  btree_map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>,_256> *this_00;
  int iVar1;
  EdgePolyline *pEVar2;
  pointer ppVar3;
  int iVar4;
  mapped_type *pmVar5;
  EdgePolyline *polyline;
  EdgePolyline *polyline_00;
  size_type __n;
  size_type __n_00;
  int j;
  pointer piVar6;
  int *piVar7;
  int iVar8;
  reference rVar9;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *__range2;
  VertexId v;
  int *local_80;
  vector<bool,_std::allocator<bool>_> *local_78;
  PolylineBuilder *local_70;
  vector<int,_std::allocator<int>_> *local_68;
  vector<int,_std::allocator<int>_> edges;
  EdgePolyline polyline_1;
  
  (__return_storage_ptr__->
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68 = &this->min_input_ids_;
  GetInputEdgeOrder(&edges,(Graph *)this,local_68);
  local_78 = &this->used_;
  this_00 = &this->excess_used_;
  local_80 = edges.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish;
  piVar7 = edges.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  piVar6 = edges.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  do {
    if (piVar6 == piVar7) {
      if (0 < this->edges_left_) {
        pEVar2 = (__return_storage_ptr__->
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        for (polyline_00 = (__return_storage_ptr__->
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start; polyline_00 != pEVar2;
            polyline_00 = polyline_00 + 1) {
          MaximizeWalk(this,polyline_00);
        }
      }
      piVar7 = (int *)0x0;
      local_70 = this;
      while ((piVar7 < (int *)((long)edges.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                               (long)edges.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start >> 2) &&
             (0 < this->edges_left_))) {
        __n = (size_type)
              edges.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start[(long)piVar7];
        local_80 = piVar7;
        rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[](local_78,__n);
        if ((*rVar9._M_p & rVar9._M_mask) == 0) {
          iVar4 = (this->g_->edges_->
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                  _M_impl.super__Vector_impl_data._M_start[__n].first;
          iVar1 = (this->min_input_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[__n];
          iVar8 = 0;
          piVar7 = local_80;
          while ((this = local_70,
                 piVar7 < (int *)((long)edges.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_finish -
                                  (long)edges.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start >> 2) &&
                 (__n_00 = (size_type)
                           edges.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[(long)piVar7],
                 (local_68->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[__n_00] == iVar1))) {
            rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[](local_78,__n_00);
            if ((*rVar9._M_p & rVar9._M_mask) == 0) {
              ppVar3 = (local_70->g_->edges_->
                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              iVar8 = (iVar8 + (uint)(ppVar3[__n_00].first == iVar4)) -
                      (uint)(ppVar3[__n_00].second == iVar4);
            }
            piVar7 = (int *)((long)piVar7 + 1);
          }
          if ((iVar8 == 1) ||
             ((local_70->g_->edges_->
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
              _M_impl.super__Vector_impl_data._M_start[__n].second == iVar4)) {
            BuildWalk((EdgePolyline *)&polyline_1.super__Vector_base<int,_std::allocator<int>_>,
                      local_70,iVar4);
            MaximizeWalk(this,(EdgePolyline *)
                              &polyline_1.super__Vector_base<int,_std::allocator<int>_>);
            std::
            vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
            ::emplace_back<std::vector<int,std::allocator<int>>>
                      ((vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                        *)__return_storage_ptr__,
                       (vector<int,_std::allocator<int>_> *)
                       &polyline_1.super__Vector_base<int,_std::allocator<int>_>);
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                      (&polyline_1.super__Vector_base<int,_std::allocator<int>_>);
          }
        }
        piVar7 = (int *)((long)local_80 + 1);
      }
      if (this->edges_left_ != 0) {
        S2LogMessage::S2LogMessage
                  ((S2LogMessage *)&polyline_1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder_graph.cc"
                   ,0x30b,kFatal,(ostream *)&std::cerr);
        std::operator<<((ostream *)
                        polyline_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish,"Check failed: (0) == (edges_left_) ");
        abort();
      }
      CanonicalizeVectorOrder(local_68,__return_storage_ptr__);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&edges.super__Vector_base<int,_std::allocator<int>_>);
      return __return_storage_ptr__;
    }
    iVar4 = *piVar6;
    rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[](local_78,(long)iVar4);
    if ((*rVar9._M_p & rVar9._M_mask) == 0) {
      v = (this->g_->edges_->
          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
          super__Vector_impl_data._M_start[iVar4].first;
      iVar4 = excess_degree(this,v);
      if (0 < iVar4) {
        pmVar5 = gtl::internal_btree::
                 btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                 ::operator[](&this_00->
                               super_btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                              ,&v);
        if (this->directed_ == true) {
          if (0 < iVar4 - *pmVar5) {
LAB_00208088:
            pmVar5 = gtl::internal_btree::
                     btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                     ::operator[](&this_00->
                                   super_btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                                  ,&v);
            *pmVar5 = *pmVar5 + 1;
            BuildWalk((EdgePolyline *)&polyline_1.super__Vector_base<int,_std::allocator<int>_>,this
                      ,v);
            std::
            vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
            ::emplace_back<std::vector<int,std::allocator<int>>>
                      ((vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                        *)__return_storage_ptr__,
                       (vector<int,_std::allocator<int>_> *)
                       &polyline_1.super__Vector_base<int,_std::allocator<int>_>);
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                      (&polyline_1.super__Vector_base<int,_std::allocator<int>_>);
            pmVar5 = gtl::internal_btree::
                     btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                     ::operator[](&this_00->
                                   super_btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                                  ,&(this->g_->edges_->
                                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start
                                    [(__return_storage_ptr__->
                                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish[-1].
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish[-1]].second);
            *pmVar5 = *pmVar5 + -1;
            piVar7 = local_80;
          }
        }
        else if ((iVar4 - *pmVar5 & 1U) != 0) goto LAB_00208088;
      }
    }
    piVar6 = piVar6 + 1;
  } while( true );
}

Assistant:

vector<Graph::EdgePolyline> Graph::PolylineBuilder::BuildWalks() {
  // Note that some of this code is worst-case quadratic in the maximum vertex
  // degree.  This could be fixed with a few extra arrays, but it should not
  // be a problem in practice.

  // First, build polylines from all vertices where outdegree > indegree (or
  // for undirected edges, vertices whose degree is odd).  We consider the
  // possible starting edges in input edge id order, for idempotency in the
  // case where multiple input polylines share vertices or edges.
  vector<EdgePolyline> polylines;
  vector<EdgeId> edges = g_.GetInputEdgeOrder(min_input_ids_);
  for (EdgeId e : edges) {
    if (used_[e]) continue;
    VertexId v = g_.edge(e).first;
    int excess = excess_degree(v);
    if (excess <= 0) continue;
    excess -= excess_used_[v];
    if (directed_ ? (excess <= 0) : (excess % 2 == 0)) continue;
    ++excess_used_[v];
    polylines.push_back(BuildWalk(v));
    --excess_used_[g_.edge(polylines.back().back()).second];
  }
  // Now all vertices have outdegree == indegree (or even degree if undirected
  // edges are being used).  Therefore all remaining edges can be assembled
  // into loops.  We first try to expand the existing polylines if possible by
  // adding loops to them.
  if (edges_left_ > 0) {
    for (EdgePolyline& polyline : polylines) {
      MaximizeWalk(&polyline);
    }
  }
  // Finally, if there are still unused edges then we build loops.  If the
  // input is a polyline that forms a loop, then for idempotency we need to
  // start from the edge with minimum input edge id.  If the minimal input
  // edge was split into several edges, then we start from the first edge of
  // the chain.
  for (int i = 0; i < edges.size() && edges_left_ > 0; ++i) {
    EdgeId e = edges[i];
    if (used_[e]) continue;

    // Determine whether the origin of this edge is the start of an edge
    // chain.  To do this, we test whether (outdegree - indegree == 1) for the
    // origin, considering only unused edges with the same minimum input edge
    // id.  (Undirected edges have input edge ids in one direction only.)
    VertexId v = g_.edge(e).first;
    InputEdgeId id = min_input_ids_[e];
    int excess = 0;
    for (int j = i; j < edges.size() && min_input_ids_[edges[j]] == id; ++j) {
      EdgeId e2 = edges[j];
      if (used_[e2]) continue;
      if (g_.edge(e2).first == v) ++excess;
      if (g_.edge(e2).second == v) --excess;
    }
    // It is also acceptable to start a polyline from any degenerate edge.
    if (excess == 1 || g_.edge(e).second == v) {
      EdgePolyline polyline = BuildWalk(v);
      MaximizeWalk(&polyline);
      polylines.push_back(std::move(polyline));
    }
  }
  S2_DCHECK_EQ(0, edges_left_);

  // Sort the polylines to correspond to the input order (if possible).
  CanonicalizeVectorOrder(min_input_ids_, &polylines);
  return polylines;
}